

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void * parserStackRealloc(void *pOld,sqlite3_uint64 newSize)

{
  int iVar1;
  void *pvVar2;
  
  if (sqlite3Config.xTestCallback != (_func_int_int *)0x0) {
    iVar1 = (*sqlite3Config.xTestCallback)(700);
    if (iVar1 != 0) {
      return (void *)0x0;
    }
  }
  pvVar2 = sqlite3_realloc(pOld,(int)newSize);
  return pvVar2;
}

Assistant:

static void *parserStackRealloc(void *pOld, sqlite3_uint64 newSize){
    return sqlite3FaultSim(700) ? 0 : sqlite3_realloc(pOld, newSize);
  }